

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

string * __thiscall ApprovalTests::Path::toString(Path *this,string *directoryPathSeparator)

{
  __type _Var1;
  string *in_RSI;
  string *in_RDI;
  string path;
  string *in_stack_00000110;
  Path *in_stack_00000118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  string local_58 [32];
  string local_38 [56];
  
  ::std::__cxx11::string::string(local_58,in_RSI);
  removeRedundantDirectorySeparators(in_stack_00000118,in_stack_00000110);
  ::std::__cxx11::string::~string(local_58);
  _Var1 = ::std::operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (_Var1) {
    ::std::__cxx11::string::string((string *)in_RDI,local_38);
  }
  else {
    ::std::__cxx11::string::string((string *)&stack0xffffffffffffff78,local_38);
    StringUtils::replaceAll
              (in_stack_ffffffffffffff88,(string *)in_stack_ffffffffffffff80,
               (string *)in_stack_ffffffffffffff78);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  }
  ::std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

std::string Path::toString(const std::string& directoryPathSeparator) const
    {
        std::string path = removeRedundantDirectorySeparators(path_);

        if (separator_ == directoryPathSeparator)
        {
            return path;
        }
        return StringUtils::replaceAll(path, separator_, directoryPathSeparator);
    }